

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O2

void __thiscall
OpenMD::P2R::P2R(P2R *this,SimInfo *info,string *filename,string *sele1,int seleOffset,uint nbins)

{
  SelectionEvaluator *this_00;
  string paramString;
  stringstream params;
  string local_1f0;
  SelectionEvaluator *local_1d0;
  SelectionManager *local_1c8;
  string *local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8 [12];
  
  StaticAnalyser::StaticAnalyser(&this->super_StaticAnalyser,info,filename,nbins);
  (this->super_StaticAnalyser)._vptr_StaticAnalyser = (_func_int **)&PTR__P2R_002ee0d8;
  this->doVect_ = false;
  this->doOffset_ = true;
  this->doOffset2_ = false;
  std::__cxx11::string::string((string *)&this->selectionScript1_,(string *)sele1);
  (this->selectionScript2_)._M_dataplus._M_p = (pointer)&(this->selectionScript2_).field_2;
  (this->selectionScript2_)._M_string_length = 0;
  (this->selectionScript2_).field_2._M_local_buf[0] = '\0';
  local_1c0 = &this->selectionScript1_;
  SelectionManager::SelectionManager(&this->seleMan1_,info);
  local_1c8 = &this->seleMan2_;
  SelectionManager::SelectionManager(local_1c8,info);
  this_00 = &this->evaluator1_;
  SelectionEvaluator::SelectionEvaluator(this_00,info);
  local_1d0 = &this->evaluator2_;
  SelectionEvaluator::SelectionEvaluator(local_1d0,info);
  this->seleOffset_ = seleOffset;
  this->seleOffset2_ = 0;
  this->nProcessed_ = 0;
  this->P2_ = 0.0;
  this->count_ = 0;
  SelectionEvaluator::loadScriptString(this_00,sele1);
  if ((this->evaluator1_).isDynamic_ == false) {
    SelectionEvaluator::evaluate((SelectionSet *)local_1b8,this_00);
    SelectionManager::setSelectionSet(&this->seleMan1_,(SelectionSet *)local_1b8);
    std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
              ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)local_1b8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1b8,
             "2nd order Legendre Polynomial Correlation using r as reference axis",
             (allocator<char> *)&local_1f0);
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).analysisType_);
  std::__cxx11::string::~string((string *)local_1b8);
  getPrefix(&local_1f0,filename);
  std::operator+(local_1b8,&local_1f0,".P2R");
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).outputFilename_);
  std::__cxx11::string::~string((string *)local_1b8);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_StaticAnalyser).paramString_);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  return;
}

Assistant:

P2R::P2R(SimInfo* info, const std::string& filename, const std::string& sele1,
           int seleOffset, unsigned int nbins) :
      StaticAnalyser(info, filename, nbins),
      doVect_(false), doOffset_(true), doOffset2_(false),
      selectionScript1_(sele1), seleMan1_(info), seleMan2_(info),
      evaluator1_(info), evaluator2_(info), seleOffset_(seleOffset) {
    evaluator1_.loadScriptString(sele1);
    if (!evaluator1_.isDynamic()) {
      seleMan1_.setSelectionSet(evaluator1_.evaluate());
    }

    setAnalysisType(
        "2nd order Legendre Polynomial Correlation using r as reference axis");
    setOutputName(getPrefix(filename) + ".P2R");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }